

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O2

void FastPForLib::Simple9<true,_false>::unpack9_3(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 >> 0x13 & 0x1ff;
  puVar2[1] = *puVar1 >> 10 & 0x1ff;
  puVar2[2] = *puVar1 >> 1 & 0x1ff;
  *in = puVar1 + 1;
  *out = puVar2 + 3;
  return;
}

Assistant:

void Simple9<MarkLength, hacked>::unpack9_3(uint32_t **out,
                                            const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 19) & 0x01ff;
  pout[1] = (pin[0] >> 10) & 0x01ff;
  pout[2] = (pin[0] >> 1) & 0x01ff;

  *in = pin + 1;
  *out = pout + 3;
}